

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O1

int __thiscall BmsNoteManager::GetKeys(BmsNoteManager *this)

{
  int iVar1;
  int i;
  long lVar2;
  int keycnt [20];
  int local_68 [22];
  
  local_68[0x10] = 0;
  local_68[0x11] = 0;
  local_68[0x12] = 0;
  local_68[0x13] = 0;
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  lVar2 = 0;
  do {
    iVar1 = BmsNoteLane::GetNoteCount(this->lanes_,true,true,false);
    local_68[lVar2] = iVar1;
    lVar2 = lVar2 + 1;
    this = (BmsNoteManager *)((long)this + 0x30);
  } while (lVar2 != 0x14);
  iVar1 = 0x12;
  if ((((((local_68[0x12] == 0) && (iVar1 = 0xe, local_68[0x11] == 0 && local_68[0x10] == 0)) &&
        (iVar1 = 10, local_68[0xf] == 0)) && ((local_68[0xe] == 0 && (local_68[0xd] == 0)))) &&
      ((local_68[0xc] == 0 && ((local_68[0xb] == 0 && (iVar1 = 9, local_68[8] == 0)))))) &&
     (iVar1 = 7, local_68[7] == 0 && local_68[6] == 0)) {
    iVar1 = (uint)(((local_68[2] != 0 || local_68[3] != 0) || (local_68[4] != 0 || local_68[5] != 0)
                   ) || local_68[1] != 0) * 5;
  }
  return iVar1;
}

Assistant:

int BmsNoteManager::GetKeys() {
	int keycnt[_MAX_NOTE_LANE] = { 0, };
	for (int i = 0; i < _MAX_NOTE_LANE; i++)
		keycnt[i] = lanes_[i].GetNoteCount();
	
	// check DP first
	if (keycnt[18])
		return 18;
	else if (keycnt[16] || keycnt[17])
		return 14;
	else if (keycnt[15] || keycnt[14] || keycnt[13] || keycnt[12] || keycnt[11])
		return 10;
	else if (keycnt[8])
		return 9;
	else if (keycnt[6] || keycnt[7])
		return 7;
	else if (keycnt[5] || keycnt[4] || keycnt[3] || keycnt[2] || keycnt[1])
		return 5;

	// unknown ..?
	return 0;
}